

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationMultiQueueTests.cpp
# Opt level: O0

void vkt::synchronization::anon_unknown_2::createBarrierMultiQueue
               (DeviceInterface *vk,VkCommandBuffer *cmdBuffer,SyncInfo *writeSync,
               SyncInfo *readSync,Resource *resource,deUint32 writeFamily,deUint32 readFamily,
               VkSharingMode sharingMode,bool secondQueue)

{
  VkImageSubresourceRange *pVVar1;
  VkAccessFlags srcAccessMask;
  VkAccessFlags dstAccessMask;
  VkImageLayout oldLayout;
  VkImageLayout newLayout;
  VkImage image;
  undefined4 uVar2;
  VkImageSubresourceRange subresourceRange;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  ResourceType RVar7;
  ImageResource *pIVar8;
  BufferResource *pBVar9;
  undefined4 local_d8 [2];
  VkBufferMemoryBarrier barrier_1;
  undefined1 local_80 [8];
  VkImageMemoryBarrier barrier;
  bool secondQueue_local;
  deUint32 writeFamily_local;
  Resource *resource_local;
  SyncInfo *readSync_local;
  SyncInfo *writeSync_local;
  VkCommandBuffer *cmdBuffer_local;
  DeviceInterface *vk_local;
  
  barrier.subresourceRange.layerCount._3_1_ = secondQueue;
  barrier._68_4_ = writeFamily;
  RVar7 = Resource::getType(resource);
  if (RVar7 == RESOURCE_TYPE_IMAGE) {
    srcAccessMask = writeSync->accessMask;
    dstAccessMask = readSync->accessMask;
    oldLayout = writeSync->imageLayout;
    newLayout = readSync->imageLayout;
    pIVar8 = Resource::getImage(resource);
    image.m_internal = (pIVar8->handle).m_internal;
    pIVar8 = Resource::getImage(resource);
    pVVar1 = &pIVar8->subresourceRange;
    barrier_1.size._0_4_ = pVVar1->aspectMask;
    barrier_1.size._4_4_ = pVVar1->baseMipLevel;
    uVar2 = (pIVar8->subresourceRange).baseArrayLayer;
    uVar3 = pVVar1->aspectMask;
    uVar4 = pVVar1->baseMipLevel;
    uVar5 = pVVar1->levelCount;
    subresourceRange.levelCount = uVar5;
    subresourceRange.baseMipLevel = uVar4;
    subresourceRange.aspectMask = uVar3;
    subresourceRange.baseArrayLayer = uVar2;
    subresourceRange.layerCount = (pIVar8->subresourceRange).layerCount;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)local_80,srcAccessMask,dstAccessMask,oldLayout,newLayout,
               image,subresourceRange);
    if ((barrier._68_4_ == readFamily) || (sharingMode != VK_SHARING_MODE_EXCLUSIVE)) {
      if ((barrier.subresourceRange.layerCount._3_1_ & 1) == 0) {
        (*vk->_vptr_DeviceInterface[0x6d])
                  (vk,*cmdBuffer,(ulong)writeSync->stageMask,(ulong)readSync->stageMask,0,0,0,0,0,1,
                   local_80);
      }
    }
    else {
      barrier.oldLayout = barrier._68_4_;
      barrier.newLayout = readFamily;
      if ((barrier.subresourceRange.layerCount._3_1_ & 1) != 0) {
        barrier.srcAccessMask = barrier.dstAccessMask;
        barrier.pNext._0_4_ = barrier.pNext._4_4_;
      }
      (*vk->_vptr_DeviceInterface[0x6d])
                (vk,*cmdBuffer,(ulong)writeSync->stageMask,(ulong)readSync->stageMask,0,0,0,0,0,1,
                 local_80);
    }
  }
  else {
    RVar7 = Resource::getType(resource);
    if (RVar7 != RESOURCE_TYPE_BUFFER) {
      RVar7 = Resource::getType(resource);
      bVar6 = isIndirectBuffer(RVar7);
      if (!bVar6) {
        return;
      }
    }
    if ((barrier._68_4_ != readFamily) && (sharingMode == VK_SHARING_MODE_EXCLUSIVE)) {
      local_d8[0] = 0x2c;
      barrier_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      barrier_1._4_4_ = 0;
      barrier_1.pNext._0_4_ = writeSync->accessMask;
      barrier_1.pNext._4_4_ = readSync->accessMask;
      barrier_1.srcAccessMask = barrier._68_4_;
      barrier_1.dstAccessMask = readFamily;
      pBVar9 = Resource::getBuffer(resource);
      barrier_1._24_8_ = (pBVar9->handle).m_internal;
      pBVar9 = Resource::getBuffer(resource);
      barrier_1.buffer.m_internal = pBVar9->offset;
      pBVar9 = Resource::getBuffer(resource);
      barrier_1.offset = pBVar9->size;
      (*vk->_vptr_DeviceInterface[0x6d])
                (vk,*cmdBuffer,(ulong)writeSync->stageMask,(ulong)readSync->stageMask,0,0,0,1,
                 (int)local_d8,0,0);
    }
  }
  return;
}

Assistant:

void createBarrierMultiQueue (const DeviceInterface&	vk,
							  const VkCommandBuffer&	cmdBuffer,
							  const SyncInfo&			writeSync,
							  const SyncInfo&			readSync,
							  const Resource&			resource,
							  const deUint32			writeFamily,
							  const deUint32			readFamily,
							  const VkSharingMode		sharingMode,
							  const bool				secondQueue = false)
{
	if (resource.getType() == RESOURCE_TYPE_IMAGE)
	{
		VkImageMemoryBarrier barrier = makeImageMemoryBarrier(writeSync.accessMask, readSync.accessMask,
			writeSync.imageLayout, readSync.imageLayout, resource.getImage().handle, resource.getImage().subresourceRange);

		if (writeFamily != readFamily && VK_SHARING_MODE_EXCLUSIVE == sharingMode)
		{
			barrier.srcQueueFamilyIndex = writeFamily;
			barrier.dstQueueFamilyIndex = readFamily;
			if (secondQueue)
			{
				barrier.oldLayout		= barrier.newLayout;
				barrier.srcAccessMask	= barrier.dstAccessMask;
			}
			vk.cmdPipelineBarrier(cmdBuffer, writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
		}
		else if (!secondQueue)
			vk.cmdPipelineBarrier(cmdBuffer, writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 0u, (const VkBufferMemoryBarrier*)DE_NULL, 1u, &barrier);
	}
	else if ((resource.getType() == RESOURCE_TYPE_BUFFER || isIndirectBuffer(resource.getType()))	&&
			 writeFamily != readFamily																&&
			 VK_SHARING_MODE_EXCLUSIVE == sharingMode)
	{
		const VkBufferMemoryBarrier barrier =
		{
			VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
			DE_NULL,									// const void*		pNext;
			writeSync.accessMask ,						// VkAccessFlags	srcAccessMask;
			readSync.accessMask,						// VkAccessFlags	dstAccessMask;
			writeFamily,								// deUint32			srcQueueFamilyIndex;
			readFamily,									// deUint32			destQueueFamilyIndex;
			resource.getBuffer().handle,				// VkBuffer			buffer;
			resource.getBuffer().offset,				// VkDeviceSize		offset;
			resource.getBuffer().size,					// VkDeviceSize		size;
		};
		vk.cmdPipelineBarrier(cmdBuffer, writeSync.stageMask, readSync.stageMask, (VkDependencyFlags)0, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, (const VkBufferMemoryBarrier*)&barrier, 0u, (const VkImageMemoryBarrier *)DE_NULL);
	}
}